

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<int_(int,_int,_int)>::TypedExpectation
          (TypedExpectation<int_(int,_int,_int)> *this,
          FunctionMockerBase<int_(int,_int,_int)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  ArgumentMatcherTuple *m_local;
  string *a_source_text_local;
  int a_line_local;
  char *a_file_local;
  FunctionMockerBase<int_(int,_int,_int)> *owner_local;
  TypedExpectation<int_(int,_int,_int)> *this_local;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002079c8;
  this->owner_ = owner;
  std::tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>::tuple
            (&this->matchers_,m);
  A<std::tuple<int,int,int>const&>();
  DoDefault();
  DoDefaultAction::operator_cast_to_Action((DoDefaultAction *)&this->repeated_action_);
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}